

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limit_relation.cpp
# Opt level: O3

unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> __thiscall
duckdb::LimitRelation::GetQueryNode(LimitRelation *this)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  Relation *pRVar2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  pointer pLVar4;
  pointer pQVar5;
  pointer *__ptr_2;
  pointer *__ptr;
  long in_RSI;
  _Head_base<0UL,_duckdb::LimitModifier_*,_false> local_a8;
  Value local_a0;
  Value local_60;
  
  pRVar2 = shared_ptr<duckdb::Relation,_true>::operator->
                     ((shared_ptr<duckdb::Relation,_true> *)(in_RSI + 0x78));
  (*pRVar2->_vptr_Relation[3])(this,pRVar2);
  local_a8._M_head_impl = (LimitModifier *)operator_new(0x20);
  ((local_a8._M_head_impl)->super_ResultModifier).type = LIMIT_MODIFIER;
  ((local_a8._M_head_impl)->super_ResultModifier)._vptr_ResultModifier =
       (_func_int **)&PTR__LimitModifier_019638d8;
  ((local_a8._M_head_impl)->limit).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  ((local_a8._M_head_impl)->offset).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> =
       (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
  if (-1 < *(long *)(in_RSI + 0x68)) {
    Value::BIGINT(&local_60,*(long *)(in_RSI + 0x68));
    _Var3._M_head_impl = (ParsedExpression *)operator_new(0x78);
    Value::Value(&local_a0,&local_60);
    ConstantExpression::ConstantExpression((ConstantExpression *)_Var3._M_head_impl,&local_a0);
    Value::~Value(&local_a0);
    pLVar4 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
             operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                         *)&local_a8);
    _Var1._M_head_impl =
         (pLVar4->limit).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->limit).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_60);
  }
  if (0 < *(long *)(in_RSI + 0x70)) {
    Value::BIGINT(&local_60,*(long *)(in_RSI + 0x70));
    _Var3._M_head_impl = (ParsedExpression *)operator_new(0x78);
    Value::Value(&local_a0,&local_60);
    ConstantExpression::ConstantExpression((ConstantExpression *)_Var3._M_head_impl,&local_a0);
    Value::~Value(&local_a0);
    pLVar4 = unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>::
             operator->((unique_ptr<duckdb::LimitModifier,_std::default_delete<duckdb::LimitModifier>,_true>
                         *)&local_a8);
    _Var1._M_head_impl =
         (pLVar4->offset).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pLVar4->offset).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (_Var1._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var1._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_60);
  }
  pQVar5 = unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true>::operator->
                     ((unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *
                      )this);
  local_a0.type_._0_8_ = local_a8._M_head_impl;
  local_a8._M_head_impl = (LimitModifier *)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>,std::allocator<duckdb::unique_ptr<duckdb::ResultModifier,std::default_delete<duckdb::ResultModifier>,true>>>
              *)&pQVar5->modifiers,
             (unique_ptr<duckdb::ResultModifier,_std::default_delete<duckdb::ResultModifier>,_true>
              *)&local_a0);
  if ((LimitModifier *)local_a0.type_._0_8_ != (LimitModifier *)0x0) {
    (*((ResultModifier *)local_a0.type_._0_8_)->_vptr_ResultModifier[1])();
  }
  if (local_a8._M_head_impl != (LimitModifier *)0x0) {
    (*((local_a8._M_head_impl)->super_ResultModifier)._vptr_ResultModifier[1])();
  }
  return (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)
         (unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)this;
}

Assistant:

unique_ptr<QueryNode> LimitRelation::GetQueryNode() {
	auto child_node = child->GetQueryNode();
	auto limit_node = make_uniq<LimitModifier>();
	if (limit >= 0) {
		limit_node->limit = make_uniq<ConstantExpression>(Value::BIGINT(limit));
	}
	if (offset > 0) {
		limit_node->offset = make_uniq<ConstantExpression>(Value::BIGINT(offset));
	}

	child_node->modifiers.push_back(std::move(limit_node));
	return child_node;
}